

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_stack.h
# Opt level: O0

void * uo_stack_pop(uo_stack *stack)

{
  void *pvVar1;
  ulong uVar2;
  void **ppvVar3;
  void *item;
  size_t count;
  uo_stack *stack_local;
  
  if (stack->count != 0) {
    uVar2 = stack->count - 1;
    stack->count = uVar2;
    pvVar1 = stack->items[uVar2];
    if ((uVar2 == stack->capacity >> 3) && (3 < uVar2)) {
      uVar2 = stack->capacity >> 1;
      stack->capacity = uVar2;
      ppvVar3 = (void **)realloc(stack->items,uVar2 << 3);
      stack->items = ppvVar3;
    }
    return pvVar1;
  }
  __assert_fail("stack->count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_stack/src/include/uo_stack/uo_stack.h"
                ,0x97,"void *uo_stack_pop(uo_stack *)");
}

Assistant:

static inline void *uo_stack_pop(
    uo_stack *stack)
{
    assert(stack->count);

    size_t count = --stack->count;
    void *item = stack->items[count];

    if (count == stack->capacity >> 3 && count >= UO_STACK_MIN_CAPACITY)
        stack->items = realloc(stack->items, sizeof *stack->items * (stack->capacity >>= 1));

    return item;
}